

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O0

void __thiscall
isotree::IsolationForest::serialize_template<std::ostream>
          (IsolationForest *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  bool bVar1;
  ostream *out_00;
  ExtIsoForest *model_ext;
  Imputer *indexer;
  char *optional_metadata;
  size_t in_RSI;
  long in_RDI;
  IsolationForest *in_stack_ffffffffffffffc0;
  Imputer *imputer;
  ExtIsoForest *model;
  
  check_is_fitted(in_stack_ffffffffffffffc0);
  bVar1 = std::
          vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
          ::empty((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    out_00 = (ostream *)0x0;
  }
  else {
    out_00 = (ostream *)(in_RDI + 0xb8);
  }
  bVar1 = std::
          vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ::empty((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    model_ext = (ExtIsoForest *)0x0;
  }
  else {
    model_ext = (ExtIsoForest *)(in_RDI + 0x100);
  }
  model = model_ext;
  bVar1 = std::
          vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ::empty((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    indexer = (Imputer *)0x0;
  }
  else {
    indexer = (Imputer *)(in_RDI + 0x148);
  }
  imputer = indexer;
  bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                    ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)indexer);
  if (bVar1) {
    optional_metadata = (char *)0x0;
  }
  else {
    optional_metadata = (char *)(in_RDI + 0x1b8);
  }
  serialize_combined((IsoForest *)model,model_ext,imputer,(TreesIndexer *)indexer,optional_metadata,
                     in_RSI,out_00);
  return;
}

Assistant:

void IsolationForest::serialize_template(otype &out) const
{
    this->check_is_fitted();

    serialize_combined(
        (!this->model.trees.empty())? &this->model : nullptr,
        (!this->model_ext.hplanes.empty())? &this->model_ext : nullptr,
        (!this->imputer.imputer_tree.empty())? &this->imputer : nullptr,
        (!this->indexer.indices.empty())? &this->indexer : nullptr,
        (char*)nullptr,
        (size_t)0,
        out
    );
}